

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

unique_ptr<char_*[],_std::default_delete<char_*[]>_>
testing::internal::CreateArgvFromArgs
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  long lVar1;
  pointer __s;
  undefined8 *puVar2;
  long *in_RSI;
  long lVar3;
  ulong __n;
  
  lVar1 = in_RSI[1] - *in_RSI >> 5;
  __n = -(ulong)(lVar1 + 1U >> 0x3d != 0) | lVar1 * 8 + 8U;
  __s = (pointer)operator_new__(__n);
  memset(__s,0,__n);
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = __s;
  puVar2 = (undefined8 *)*in_RSI;
  lVar1 = in_RSI[1] - (long)puVar2 >> 5;
  if ((undefined8 *)in_RSI[1] != puVar2) {
    lVar3 = 0;
    do {
      (&__s->_M_dataplus)[lVar3]._M_p = (pointer)*puVar2;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + 4;
    } while (lVar1 + (ulong)(lVar1 == 0) != lVar3);
  }
  (&__s->_M_dataplus)[lVar1]._M_p = (pointer)0x0;
  return (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)
         (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)args;
}

Assistant:

std::unique_ptr<char*[]> CreateArgvFromArgs(std::vector<std::string>& args) {
  auto result = std::make_unique<char*[]>(args.size() + 1);
  for (size_t i = 0; i < args.size(); ++i) {
    result[i] = &args[i][0];
  }
  result[args.size()] = nullptr;  // extra null terminator
  return result;
}